

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::
prepare_compute_shader
          (string *__return_storage_ptr__,
          ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type,string *tested_declaration,string *tested_snippet)

{
  string *tested_snippet_local;
  string *tested_declaration_local;
  TestShaderType tested_shader_type_local;
  ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  string *compute_shader_source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (tested_shader_type == COMPUTE_SHADER_TYPE) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "writeonly uniform image2D uni_image;\n\nvoid main()\n{\n    float result = 1u;\n\n")
    ;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)tested_declaration);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)tested_snippet);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "\n    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n}\n\n"
              );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionsLength1<API>::prepare_compute_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& tested_declaration,
	const std::string& tested_snippet)
{
	std::string compute_shader_source;

	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type)
	{
		compute_shader_source = "writeonly uniform image2D uni_image;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    float result = 1u;\n"
								"\n";
		compute_shader_source += tested_declaration;
		compute_shader_source += tested_snippet;
		compute_shader_source += "\n"
								 "    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n"
								 "}\n"
								 "\n";
	}

	return compute_shader_source;
}